

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O2

void * invoke_writer_ops(void *args)

{
  FileHandlePool *pFVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  ts_nsec tVar3;
  size_t sVar4;
  size_t sVar5;
  ts_nsec tVar6;
  uint64_t uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int local_254;
  undefined8 *local_250;
  ulong local_248;
  long local_240;
  char bodybuf [256];
  char keybuf [256];
  
  local_240 = std::chrono::_V2::system_clock::now();
  local_248 = 0;
  local_250 = (undefined8 *)args;
  do {
    dbfile = (fdb_file_handle *)0x0;
    db = (fdb_kvs_handle *)0x0;
    local_254 = FileHandlePool::getAvailableResource(*args,&dbfile,&db);
    fVar2 = fdb_begin_transaction(dbfile,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x169,(long)fVar2,0);
    }
    for (iVar10 = 0; uVar9 = (int)local_248 + iVar10, iVar10 != 9; iVar10 = iVar10 + 1) {
      sprintf(keybuf,"key%d",(ulong)uVar9);
      sprintf(bodybuf,"body%d",(ulong)uVar9);
      tVar3 = get_monotonic_ts();
      handle = db;
      sVar4 = strlen(keybuf);
      sVar5 = strlen(bodybuf);
      fVar2 = fdb_set_kv(handle,keybuf,sVar4 + 1,bodybuf,sVar5 + 1);
      tVar6 = get_monotonic_ts();
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fdb_assert_die("status == FDB_RESULT_SUCCESS",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                       ,0x176,(long)fVar2,0);
      }
      pFVar1 = (FileHandlePool *)*local_250;
      uVar7 = ts_diff(tVar3,tVar6);
      FileHandlePool::collectStat(pFVar1,0,uVar7);
    }
    tVar3 = get_monotonic_ts();
    fVar2 = fdb_end_transaction(dbfile,'\0');
    tVar6 = get_monotonic_ts();
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x17f,(long)fVar2,0);
    }
    args = local_250;
    pFVar1 = (FileHandlePool *)*local_250;
    uVar7 = ts_diff(tVar3,tVar6);
    FileHandlePool::collectStat(pFVar1,1,uVar7);
    iVar10 = local_254;
    if (*(char *)((long)args + 0xc) == '\x01') {
      SnapHandlePool::addNewSnapHandle(*args,local_254,db);
    }
    FileHandlePool::returnResourceToPool(*args,iVar10);
    lVar8 = std::chrono::_V2::system_clock::now();
    local_248 = (ulong)uVar9;
  } while ((double)(lVar8 - local_240) / 1000000000.0 <= (double)*(float *)((long)args + 8));
  pthread_exit((void *)0x0);
}

Assistant:

static void *invoke_writer_ops(void *args) {
    struct ops_args *oa = static_cast<ops_args *>(args);
    int i = 0, j;
    fdb_status status;
    std::chrono::time_point<std::chrono::system_clock> start, end;
    start = std::chrono::system_clock::now();

    while (true) {
        // Acquire handles from pool
        fdb_file_handle *dbfile = nullptr;
        fdb_kvs_handle *db = nullptr;
        const int index = oa->hp->getAvailableResource(&dbfile, &db);

        char keybuf[256], bodybuf[256];

        // Start transaction
        status = fdb_begin_transaction(dbfile, FDB_ISOLATION_READ_COMMITTED);
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        // Issue a batch of 10 sets
        j = 10;
        while (--j != 0) {
            sprintf(keybuf, "key%d", i);
            sprintf(bodybuf, "body%d", i);

            ts_nsec beginSet = get_monotonic_ts();
            status = fdb_set_kv(db,
                                (void*)keybuf, strlen(keybuf) + 1,
                                (void*)bodybuf, strlen(bodybuf) + 1);
            ts_nsec endSet = get_monotonic_ts();
            fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
            oa->hp->collectStat(SET, ts_diff(beginSet, endSet));
            ++i;
        }

        // End transaction (Commit)
        ts_nsec beginCommit = get_monotonic_ts();
        status = fdb_end_transaction(dbfile, FDB_COMMIT_NORMAL);
        ts_nsec endCommit = get_monotonic_ts();
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        oa->hp->collectStat(COMMIT, ts_diff(beginCommit, endCommit));

        // Create a snapshot handle if snap handle pool is in use
        if (oa->snapPoolAvailable) {
            (static_cast<SnapHandlePool*>(oa->hp))->addNewSnapHandle(index, db);
        }

        // Return resource to pool
        oa->hp->returnResourceToPool(index);

        end = std::chrono::system_clock::now();
        std::chrono::duration<double> elapsed_seconds = end - start;
        if (elapsed_seconds.count() > oa->time) {
#ifdef __DEBUG_USECASE
            fprintf(stderr, "Writer: Ends after %fs\n", elapsed_seconds.count());
#endif
            break;
        }
    }
    thread_exit(0);
    return nullptr;
}